

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O0

size_t sets_union<320ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  const_reference pvVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t sVar4;
  ulong local_48;
  size_t i;
  value_type x;
  array<unsigned_long,_5UL> *c_local;
  vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_> *binary_sets_local;
  
  x.super__Base_bitset<5UL>._M_w[4] = (_WordT)c;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](c,0);
  pvVar2 = std::vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_>::operator[]
                     (binary_sets,*pvVar1);
  memcpy(&i,pvVar2,0x28);
  local_48 = 1;
  while( true ) {
    sVar3 = std::array<unsigned_long,_5UL>::size
                      ((array<unsigned_long,_5UL> *)x.super__Base_bitset<5UL>._M_w[4]);
    if (sVar3 <= local_48) break;
    pvVar1 = std::array<unsigned_long,_5UL>::operator[]
                       ((array<unsigned_long,_5UL> *)x.super__Base_bitset<5UL>._M_w[4],local_48);
    pvVar2 = std::vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_>::operator[]
                       (binary_sets,*pvVar1);
    std::bitset<320UL>::operator|=((bitset<320UL> *)&i,pvVar2);
    local_48 = local_48 + 1;
  }
  sVar4 = std::bitset<320UL>::count((bitset<320UL> *)&i);
  return sVar4;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}